

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode deleteReference(UA_Server *server,UA_Session *session,UA_DeleteReferencesItem *item)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_DeleteReferencesItem *in_RCX;
  UA_Node *node;
  UA_Node *node_00;
  UA_Server *pUVar3;
  undefined1 auStack_88 [8];
  UA_DeleteReferencesItem secondItem;
  
  ppUVar2 = findNode(server->nodestore,(UA_NodeId *)session);
  if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
    pUVar3 = (UA_Server *)0x0;
  }
  else {
    pUVar3 = (UA_Server *)&(*ppUVar2)->node;
  }
  if (pUVar3 == (UA_Server *)0x0) {
    UVar1 = 0x80340000;
  }
  else {
    UVar1 = deleteOneWayReference(pUVar3,session,node,in_RCX);
  }
  if (((UVar1 == 0) && (UVar1 = 0, (char)(session->clientDescription).discoveryUrlsSize == '\x01'))
     && (*(int *)&(session->clientDescription).discoveryProfileUri.data == 0)) {
    secondItem.targetNodeId.namespaceUri.data = (UA_Byte *)0x0;
    secondItem.targetNodeId.serverIndex = 0;
    secondItem.targetNodeId._44_4_ = 0;
    secondItem.targetNodeId.nodeId.identifier.string.data = (UA_Byte *)0x0;
    secondItem.targetNodeId.namespaceUri.length = 0;
    secondItem.referenceTypeId.identifier.string.data =
         (UA_Byte *)((ulong)(byte)(session->clientDescription).applicationName.text.length ^ 1);
    secondItem.sourceNodeId.identifier.string.length =
         (session->clientDescription).gatewayServerUri.length;
    auStack_88 = (undefined1  [8])(session->clientDescription).applicationName.text.data;
    secondItem.sourceNodeId._0_8_ = *(undefined8 *)&(session->clientDescription).applicationType;
    secondItem.targetNodeId.nodeId.identifier.string.length =
         (session->clientDescription).productUri.length;
    secondItem._48_8_ = (session->clientDescription).applicationUri.length;
    secondItem.targetNodeId.nodeId._0_8_ = (session->clientDescription).applicationUri.data;
    secondItem.sourceNodeId.identifier.string.data = (session->clientDescription).productUri.data;
    secondItem.referenceTypeId._0_8_ = (session->clientDescription).applicationName.locale.length;
    secondItem.referenceTypeId.identifier.string.length =
         (size_t)(session->clientDescription).applicationName.locale.data;
    ppUVar2 = findNode(server->nodestore,(UA_NodeId *)auStack_88);
    if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
      pUVar3 = (UA_Server *)0x0;
    }
    else {
      pUVar3 = (UA_Server *)&(*ppUVar2)->node;
    }
    if (pUVar3 == (UA_Server *)0x0) {
      UVar1 = 0x80340000;
    }
    else {
      UVar1 = deleteOneWayReference(pUVar3,(UA_Session *)auStack_88,node_00,in_RCX);
    }
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
deleteReference(UA_Server *server, UA_Session *session,
                const UA_DeleteReferencesItem *item) {
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)deleteOneWayReference, item);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    if(!item->deleteBidirectional || item->targetNodeId.serverIndex != 0)
        return retval;
    UA_DeleteReferencesItem secondItem;
    UA_DeleteReferencesItem_init(&secondItem);
    secondItem.isForward = !item->isForward;
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    return UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                              (UA_EditNodeCallback)deleteOneWayReference, &secondItem);
}